

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O0

void Gia_ManMinCex(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  Cnf_Dat_t *pCVar1;
  sat_solver *p_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Abc_Cex_t *pAVar8;
  abctime aVar9;
  Gia_Man_t *pGia;
  int *piVar10;
  int *end;
  Gia_Man_t *pFrames;
  Abc_Cex_t *pCexCare;
  int *pFinal;
  Cnf_Dat_t *pCStack_50;
  int nFinal;
  Cnf_Dat_t *pCnf;
  sat_solver *pSat;
  Vec_Int_t *vLits;
  int Counter;
  int status;
  int iLit;
  int iFirstVar;
  int i;
  int n;
  abctime clk;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  clk = (abctime)pCex;
  pCex_local = (Abc_Cex_t *)p;
  _i = Abc_Clock();
  vLits._0_4_ = 0;
  _i = Abc_Clock();
  pAVar8 = pCex_local;
  iVar3 = Gia_ManPiNum((Gia_Man_t *)pCex_local);
  pAVar8 = Bmc_CexCareMinimizeAig((Gia_Man_t *)pAVar8,iVar3,(Abc_Cex_t *)clk,1,1,1);
  for (iLit = pAVar8->nRegs; iLit < pAVar8->nBits; iLit = iLit + 1) {
    iVar3 = Abc_InfoHasBit((uint *)(pAVar8 + 1),iLit);
    vLits._0_4_ = iVar3 + (uint)vLits;
  }
  Abc_CexFree(pAVar8);
  printf("Care bits = %d. ",(ulong)(uint)vLits);
  aVar9 = Abc_Clock();
  Abc_PrintTime(1,"CEX minimization",aVar9 - _i);
  _i = Abc_Clock();
  pGia = Gia_ManFramesForCexMin((Gia_Man_t *)pCex_local,*(int *)(clk + 4) + 1);
  pCStack_50 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,0,0,0);
  status = pCStack_50->nVars - (*(int *)(clk + 4) + 1) * *(int *)(clk + 0xc);
  pCnf = (Cnf_Dat_t *)Cnf_DataWriteIntoSolver(pCStack_50,1,0);
  Counter = Abc_Var2Lit(1,1);
  vLits._4_4_ = sat_solver_addclause((sat_solver *)pCnf,&Counter,&status);
  if (vLits._4_4_ != 0) {
    pSat = (sat_solver *)Vec_IntAlloc(100);
    for (iLit = *(int *)(clk + 8); p_00 = pSat, iLit < *(int *)(clk + 0x10); iLit = iLit + 1) {
      iVar4 = status + iLit;
      iVar3 = *(int *)(clk + 8);
      iVar5 = Abc_InfoHasBit((uint *)(clk + 0x14),iLit);
      iVar3 = Abc_Var2Lit(iVar4 - iVar3,(uint)((iVar5 != 0 ^ 0xffU) & 1));
      Vec_IntPush((Vec_Int_t *)p_00,iVar3);
    }
    aVar9 = Abc_Clock();
    Abc_PrintTime(1,"SAT solver",aVar9 - _i);
    for (iFirstVar = 0; iFirstVar < 2; iFirstVar = iFirstVar + 1) {
      if (iFirstVar != 0) {
        Vec_IntReverseOrder((Vec_Int_t *)pSat);
      }
      _i = Abc_Clock();
      pCVar1 = pCnf;
      piVar10 = Vec_IntArray((Vec_Int_t *)pSat);
      end = Vec_IntLimit((Vec_Int_t *)pSat);
      vLits._4_4_ = sat_solver_solve((sat_solver *)pCVar1,piVar10,end,0,0,0,0);
      uVar6 = sat_solver_final((sat_solver *)pCnf,(int **)&pCexCare);
      uVar2 = vLits._4_4_;
      pFinal._4_4_ = uVar6;
      Vec_IntSize((Vec_Int_t *)pSat);
      printf("Status %d.  Selected %d assumptions out of %d.  ",(ulong)uVar2,(ulong)uVar6);
      aVar9 = Abc_Clock();
      Abc_PrintTime(1,"Analyze_final",aVar9 - _i);
      _i = Abc_Clock();
      pCVar1 = pCnf;
      piVar10 = Vec_IntArray((Vec_Int_t *)pSat);
      iVar3 = Vec_IntSize((Vec_Int_t *)pSat);
      uVar6 = sat_solver_minimize_assumptions((sat_solver *)pCVar1,piVar10,iVar3,0);
      uVar2 = vLits._4_4_;
      pFinal._4_4_ = uVar6;
      uVar7 = Vec_IntSize((Vec_Int_t *)pSat);
      printf("Status %d.  Selected %d assumptions out of %d.  ",(ulong)uVar2,(ulong)uVar6,
             (ulong)uVar7);
      aVar9 = Abc_Clock();
      Abc_PrintTime(1,"LEXUNSAT",aVar9 - _i);
    }
    Vec_IntFree((Vec_Int_t *)pSat);
    sat_solver_delete((sat_solver *)pCnf);
    Cnf_DataFree(pCStack_50);
    Gia_ManStop(pGia);
    return;
  }
  __assert_fail("status",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                ,0x1d6,"void Gia_ManMinCex(Gia_Man_t *, Abc_Cex_t *)");
}

Assistant:

void Gia_ManMinCex( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    abctime clk = Abc_Clock();
    int n, i, iFirstVar, iLit, status, Counter = 0;//, Id;
    Vec_Int_t * vLits;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    int nFinal, * pFinal;
    Abc_Cex_t * pCexCare;
    Gia_Man_t * pFrames;

    // CEX minimization
    clk = Abc_Clock();
    pCexCare = Bmc_CexCareMinimizeAig( p, Gia_ManPiNum(p), pCex, 1, 1, 1 );
    for ( i = pCexCare->nRegs; i < pCexCare->nBits; i++ )
        Counter += Abc_InfoHasBit(pCexCare->pData, i);
    Abc_CexFree( pCexCare );
    printf( "Care bits = %d. ", Counter );
    Abc_PrintTime( 1, "CEX minimization", Abc_Clock() - clk );

    // SAT instance
    clk = Abc_Clock();
    pFrames = Gia_ManFramesForCexMin( p, pCex->iFrame + 1 );
    pCnf = (Cnf_Dat_t*)Mf_ManGenerateCnf( pFrames, 8, 0, 0, 0, 0 );
    iFirstVar = pCnf->nVars - (pCex->iFrame+1) * pCex->nPis;
    pSat = (sat_solver*)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iLit = Abc_Var2Lit( 1, 1 );
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );
    // create literals
    vLits = Vec_IntAlloc( 100 );
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(iFirstVar + i - pCex->nRegs, !Abc_InfoHasBit(pCex->pData, i)) );
    Abc_PrintTime( 1, "SAT solver", Abc_Clock() - clk );

    for ( n = 0; n < 2; n++ )
    {
        if ( n ) Vec_IntReverseOrder( vLits );

        // SAT-based minimization
        clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        nFinal = sat_solver_final( pSat, &pFinal );
        printf( "Status %d.  Selected %d assumptions out of %d.  ", status, nFinal, Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "Analyze_final", Abc_Clock() - clk );

        // SAT-based minimization
        clk = Abc_Clock();
        nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
        printf( "Status %d.  Selected %d assumptions out of %d.  ", status, nFinal, Vec_IntSize(vLits) );
        Abc_PrintTime( 1, "LEXUNSAT", Abc_Clock() - clk );
    }

    // cleanup
    Vec_IntFree( vLits );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pFrames );
}